

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

bool spdlog::details::os::create_dir(filename_t *path)

{
  bool bVar1;
  ulong uVar2;
  filename_t local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> subdir;
  long local_28;
  size_type token_pos;
  size_t search_offset;
  filename_t *path_local;
  
  bVar1 = path_exists(path);
  if (bVar1) {
    path_local._7_1_ = 1;
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      token_pos = 0;
      do {
        local_28 = std::__cxx11::string::find_first_of((char *)path,0x277876);
        if (local_28 == -1) {
          local_28 = std::__cxx11::string::size();
        }
        std::__cxx11::string::substr((ulong)local_48,(ulong)path);
        uVar2 = std::__cxx11::string::empty();
        if ((((uVar2 & 1) != 0) || (bVar1 = path_exists(local_48), bVar1)) ||
           (bVar1 = mkdir_(local_48), bVar1)) {
          token_pos = local_28 + 1;
          bVar1 = false;
        }
        else {
          path_local._7_1_ = 0;
          bVar1 = true;
        }
        std::__cxx11::string::~string((string *)local_48);
        if (bVar1) goto LAB_0017d468;
        uVar2 = std::__cxx11::string::size();
      } while (token_pos < uVar2);
      path_local._7_1_ = 1;
    }
    else {
      path_local._7_1_ = 0;
    }
  }
LAB_0017d468:
  return (bool)(path_local._7_1_ & 1);
}

Assistant:

SPDLOG_INLINE bool create_dir(const filename_t &path) {
    if (path_exists(path)) {
        return true;
    }

    if (path.empty()) {
        return false;
    }

    size_t search_offset = 0;
    do {
        auto token_pos = path.find_first_of(folder_seps_filename, search_offset);
        // treat the entire path as a folder if no folder separator not found
        if (token_pos == filename_t::npos) {
            token_pos = path.size();
        }

        auto subdir = path.substr(0, token_pos);
#ifdef _WIN32
        // if subdir is just a drive letter, add a slash e.g. "c:"=>"c:\",
        // otherwise path_exists(subdir) returns false (issue #3079)
        const bool is_drive = subdir.length() == 2 && subdir[1] == ':';
        if (is_drive) {
            subdir += '\\';
            token_pos++;
        }
#endif

        if (!subdir.empty() && !path_exists(subdir) && !mkdir_(subdir)) {
            return false;  // return error if failed creating dir
        }
        search_offset = token_pos + 1;
    } while (search_offset < path.size());

    return true;
}